

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

Vec3fa __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
                   *this,uint primID)

{
  float fVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  RefCount RVar10;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vec3fa VVar18;
  
  plVar3 = *(long **)(CONCAT44(in_register_00000034,primID) + 0x188);
  uVar2 = *(uint *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                   (in_RDX & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar4 = *plVar3;
  lVar5 = plVar3[2];
  lVar11 = (ulong)(uVar2 + 1) * lVar5;
  lVar12 = (ulong)(uVar2 + 2) * lVar5;
  lVar13 = (ulong)(uVar2 + 3) * lVar5;
  fVar1 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + (ulong)uVar2 * lVar5),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + (ulong)uVar2 * lVar5))),
                         0x30);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar11),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar11))),0x30);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar12),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar12))),0x30);
  auVar16._8_4_ = 0x3e2aaaab;
  auVar16._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar16._12_4_ = 0x3e2aaaab;
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar13),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar13))),0x30);
  auVar15._0_4_ = auVar8._0_4_ * 0.16666667;
  auVar15._4_4_ = auVar8._4_4_ * 0.16666667;
  auVar15._8_4_ = auVar8._8_4_ * 0.16666667;
  auVar15._12_4_ = auVar8._12_4_ * 0.16666667;
  auVar17._8_4_ = 0x3f2aaaab;
  auVar17._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar17._12_4_ = 0x3f2aaaab;
  auVar14 = vfmadd231ps_fma(auVar15,auVar7,auVar17);
  auVar6 = vfmadd231ps_fma(auVar14,auVar16,auVar6);
  auVar14._0_4_ = auVar9._0_4_ * 0.16666667;
  auVar14._4_4_ = auVar9._4_4_ * 0.16666667;
  auVar14._8_4_ = auVar9._8_4_ * 0.16666667;
  auVar14._12_4_ = auVar9._12_4_ * 0.16666667;
  auVar8 = vfmadd231ps_fma(auVar14,auVar8,auVar17);
  auVar8 = vfmadd231ps_fma(auVar8,auVar7,auVar16);
  RVar10 = (RefCount)vsubps_avx(auVar8,auVar6);
  (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.super_Geometry.
  super_RefCount = RVar10;
  VVar18.field_0._0_8_ = RVar10._vptr_RefCount;
  VVar18.field_0._8_8_ = auVar7._0_8_;
  return (Vec3fa)VVar18.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID) const
      {
        const Curve3ff c = getCurveScaledRadius(primID);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }